

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowRankExecutor::EvaluateInternal
          (WindowRankExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExecutorLocalState *this_00;
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  long *plVar6;
  reference pvVar7;
  pointer this_01;
  idx_t iVar8;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var9;
  _func_int **pp_Var10;
  long lVar11;
  idx_t iVar12;
  
  pdVar2 = result->data;
  this_00 = lstate + 2;
  if (*(char *)&gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == '\x01') {
    pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,6);
    pdVar3 = pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,7);
    if (gstate[1].executor == (WindowExecutor *)0x0) {
      pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,2);
      if (count != 0) {
        pdVar4 = pvVar7->data;
        iVar12 = 0;
        do {
          puVar1 = (ulong *)(pdVar3 + iVar12 * 8);
          lVar11 = 0;
          if (*puVar1 <= *(ulong *)(pdVar4 + iVar12 * 8)) {
            lVar11 = *(ulong *)(pdVar4 + iVar12 * 8) - *puVar1;
          }
          *(long *)(pdVar2 + iVar12 * 8) = lVar11 + 1;
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
      }
    }
    else if (count != 0) {
      pdVar4 = pvVar7->data;
      iVar12 = 0;
      do {
        this_01 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)&gstate[1].executor);
        iVar8 = WindowTokenTree::Rank
                          (this_01,*(idx_t *)(pdVar3 + iVar12 * 8),*(idx_t *)(pdVar4 + iVar12 * 8),
                           row_idx + iVar12);
        *(idx_t *)(pdVar2 + iVar12 * 8) = iVar8;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
  }
  else {
    pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,0);
    plVar5 = (long *)pvVar7->data;
    pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_00,2);
    plVar6 = (long *)pvVar7->data;
    _Var9._M_head_impl = (WindowCursor *)((*plVar6 - *plVar5) + 1);
    lstate[0x12].range_cursor.
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = _Var9._M_head_impl;
    lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState =
         (_func_int **)(row_idx - *plVar6);
    if (count != 0) {
      iVar12 = 0;
      do {
        if (row_idx + iVar12 == plVar5[iVar12]) {
          _Var9._M_head_impl = (WindowCursor *)&DAT_00000001;
          lstate[0x11].range_cursor.
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x1;
LAB_011a0fd3:
          lstate[0x12].range_cursor.
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = _Var9._M_head_impl;
          pp_Var10 = (_func_int **)0x1;
        }
        else {
          if (row_idx + iVar12 == plVar6[iVar12]) {
            lstate[0x11].range_cursor.
            super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
            super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
            .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
                 ((WindowCursor *)
                 ((long)&(lstate[0x11].range_cursor.
                          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl)->paged
                 + 1))._M_head_impl;
            _Var9._M_head_impl =
                 (WindowCursor *)
                 ((long)&(_Var9._M_head_impl)->paged +
                 (long)lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState);
            goto LAB_011a0fd3;
          }
          pp_Var10 = (_func_int **)
                     ((long)lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState + 1);
        }
        lstate[0x12].super_WindowExecutorState._vptr_WindowExecutorState = pp_Var10;
        *(WindowCursor **)(pdVar2 + iVar12 * 8) = _Var9._M_head_impl;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
  }
  return;
}

Assistant:

void WindowRankExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                          DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &gpeer = gstate.Cast<WindowPeerGlobalState>();
	auto &lpeer = lstate.Cast<WindowPeerLocalState>();
	auto rdata = FlatVector::GetData<uint64_t>(result);

	if (gpeer.use_framing) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lpeer.bounds.data[FRAME_END]);
		if (gpeer.token_tree) {
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				rdata[i] = gpeer.token_tree->Rank(frame_begin[i], frame_end[i], row_idx);
			}
		} else {
			auto peer_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_BEGIN]);
			for (idx_t i = 0; i < count; ++i, ++row_idx) {
				//	Clamp peer to the frame
				const auto frame_peer_begin = MaxValue(frame_begin[i], peer_begin[i]);
				rdata[i] = (frame_peer_begin - frame_begin[i]) + 1;
			}
		}
		return;
	}

	//	Reset to "previous" row
	auto partition_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PARTITION_BEGIN]);
	auto peer_begin = FlatVector::GetData<const idx_t>(lpeer.bounds.data[PEER_BEGIN]);
	lpeer.rank = (peer_begin[0] - partition_begin[0]) + 1;
	lpeer.rank_equal = (row_idx - peer_begin[0]);

	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		lpeer.NextRank(partition_begin[i], peer_begin[i], row_idx);
		rdata[i] = lpeer.rank;
	}
}